

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O0

laszip_I32
laszip_set_geodouble_params(laszip_POINTER pointer,laszip_U32 number,laszip_F64 *geodouble_params)

{
  laszip_I32 lVar1;
  laszip_dll_struct *laszip_dll;
  laszip_F64 *geodouble_params_local;
  laszip_U32 number_local;
  laszip_POINTER pointer_local;
  
  if (pointer == (laszip_POINTER)0x0) {
    pointer_local._4_4_ = 1;
  }
  else if (number == 0) {
    snprintf((char *)((long)pointer + 0x248),0x400,"number of geodouble_params is zero");
    pointer_local._4_4_ = 1;
  }
  else if (geodouble_params == (laszip_F64 *)0x0) {
    snprintf((char *)((long)pointer + 0x248),0x400,"laszip_F64 pointer \'geodouble_params\' is zero"
            );
    pointer_local._4_4_ = 1;
  }
  else if (*(long *)((long)pointer + 0x228) == 0) {
    if (*(long *)((long)pointer + 0x238) == 0) {
      lVar1 = laszip_add_vlr(pointer,"LASF_Projection",0x87b0,(laszip_U16)(number << 3),
                             (laszip_CHAR *)0x0,(laszip_U8 *)geodouble_params);
      if (lVar1 == 0) {
        *(undefined1 *)((long)pointer + 0x248) = 0;
        pointer_local._4_4_ = 0;
      }
      else {
        snprintf((char *)((long)pointer + 0x248),0x400,"setting %u geodouble_params",(ulong)number);
        pointer_local._4_4_ = 1;
      }
    }
    else {
      snprintf((char *)((long)pointer + 0x248),0x400,
               "cannot set geodouble_params after writer was opened");
      pointer_local._4_4_ = 1;
    }
  }
  else {
    snprintf((char *)((long)pointer + 0x248),0x400,
             "cannot set geodouble_params after reader was opened");
    pointer_local._4_4_ = 1;
  }
  return pointer_local._4_4_;
}

Assistant:

LASZIP_API laszip_I32
laszip_set_geodouble_params(
    laszip_POINTER                     pointer
    , laszip_U32                       number
    , const laszip_F64*                geodouble_params
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  try
  {
    if (number == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "number of geodouble_params is zero");
      return 1;
    }

    if (geodouble_params == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "laszip_F64 pointer 'geodouble_params' is zero");
      return 1;
    }

    if (laszip_dll->reader)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "cannot set geodouble_params after reader was opened");
      return 1;
    }

    if (laszip_dll->writer)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "cannot set geodouble_params after writer was opened");
      return 1;
    }

    // add the VLR

    if (laszip_add_vlr(laszip_dll, "LASF_Projection", 34736, (laszip_U16)(number*8), 0, (const laszip_U8*)geodouble_params))
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "setting %u geodouble_params", number);
      return 1;
    }
  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_set_geodouble_params");
    return 1;
  }

  laszip_dll->error[0] = '\0';
  return 0;
}